

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

bool getIndexed(Image *output,vector<unsigned_char,_std::allocator<unsigned_char>_> *input,Size size
               ,bool isSwitch,int colors)

{
  pointer *ppCVar1;
  int iVar2;
  uint8_t uVar3;
  iterator __position;
  pointer pCVar4;
  ulong uVar5;
  iterator __begin1;
  pointer pCVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  Color *pCVar8;
  long lVar9;
  pointer puVar10;
  pointer puVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  vector<Color,_std::allocator<Color>_> table;
  allocator_type local_4d;
  undefined4 local_4c;
  void *local_48 [2];
  long local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,isSwitch);
  iVar14 = size.width;
  iVar12 = size.height * iVar14;
  pCVar8 = (Color *)(input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(colors << 2);
  std::vector<Color,std::allocator<Color>>::vector<Color*,void>
            ((vector<Color,std::allocator<Color>> *)local_48,pCVar8,(Color *)(&pCVar8->r + lVar9),
             &local_4d);
  output->size = size;
  pCVar6 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar6) {
    (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar6;
  }
  iVar2 = iVar12 + colors * 4;
  if (0 < iVar12) {
    do {
      pCVar8 = (Color *)((ulong)(input->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start[lVar9] * 4 +
                        (long)local_48[0]);
      __position._M_current =
           (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Color,std::allocator<Color>>::_M_realloc_insert<Color_const&>
                  ((vector<Color,std::allocator<Color>> *)&output->colorData,__position,pCVar8);
      }
      else {
        *__position._M_current = *pCVar8;
        ppCVar1 = &(output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar2);
  }
  uVar13 = (ulong)iVar2;
  puVar11 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar10 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (uVar13 < (ulong)((long)puVar10 - (long)puVar11)) {
    iVar12 = (output->size).width;
    pCVar6 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    do {
      uVar5 = (ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
      pCVar6[(int)((long)uVar5 / (long)iVar14) * iVar12 + (int)((long)uVar5 % (long)iVar14)].a =
           puVar11[uVar7 + uVar13];
      lVar9 = uVar7 + uVar13;
      uVar7 = uVar7 + 1;
    } while (lVar9 + 1U < (ulong)((long)puVar10 - (long)puVar11));
  }
  if ((char)local_4c == '\0') {
    pCVar6 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar4 = (output->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar6 != pCVar4) {
      do {
        uVar3 = pCVar6->b;
        pCVar6->b = pCVar6->r;
        pCVar6->r = uVar3;
        pCVar6 = pCVar6 + 1;
      } while (pCVar6 != pCVar4);
      puVar11 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar10 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return (long)puVar10 - (long)puVar11 != uVar13;
}

Assistant:

bool getIndexed(Image &output, const std::vector<uint8_t> &input, Size size, bool isSwitch, int colors) {
	assert(input.size() >= colors * 4 + size.area());
	int imgStart = colors * 4;
	int maskStart = imgStart + size.area();
	std::vector<Color> table((Color *)&input[0], (Color *)&input[imgStart]);

	output.size = size;
	output.colorData.clear();
	for (int i = imgStart; i < maskStart; i++) {
		output.colorData.push_back(table[input[i]]);
	}
	for (int i = maskStart; i < input.size(); i++) {
		int x = (i - maskStart) % size.width;
		int y = (i - maskStart) / size.width;
		output.pixel(x, y).a = input[i];
	}

	if (!isSwitch) { swapBR(output); }
	return maskStart != input.size();
}